

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O3

void __thiscall hedg::Framework::initialize(Framework *this)

{
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  Publisher *pPVar1;
  Market_Handler *__ptr;
  int nThreads;
  Market_Handler *pMVar2;
  Publisher *local_1a0;
  reference_wrapper<boost::asio::io_context> local_198;
  reference_wrapper<boost::asio::ssl::context> local_190;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_188;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_118;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  threadsafe_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>
  *local_38;
  
  this_00 = &this->threads;
  local_188._M_buckets = (__buckets_ptr)MarketGenerator::generate;
  local_188._M_bucket_count = 0;
  local_1a0 = (Publisher *)&this->gen;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::MarketGenerator::*)(),hedg::MarketGenerator*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,
             (offset_in_MarketGenerator_to_subr *)&local_188,(MarketGenerator **)&local_1a0);
  local_188._M_buckets = (__buckets_ptr)Publisher::run;
  local_188._M_bucket_count = 0;
  pPVar1 = &this->pub;
  local_1a0 = pPVar1;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(),hedg::Publisher*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,
             (offset_in_Publisher_to_subr *)&local_188,&local_1a0);
  local_188._M_buckets = (__buckets_ptr)Publisher::order_subscribe;
  local_188._M_bucket_count = 0;
  local_1a0 = pPVar1;
  local_198._M_data = &this->service;
  local_190._M_data = &this->context;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(boost::asio::io_context&,boost::asio::ssl::context&),hedg::Publisher*,std::reference_wrapper<boost::asio::io_context>,std::reference_wrapper<boost::asio::ssl::context>>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,
             (offset_in_Publisher_to_subr *)&local_188,&local_1a0,&local_198,&local_190);
  local_188._M_buckets = (__buckets_ptr)Publisher::clean_up_markets;
  local_188._M_bucket_count = 0;
  local_1a0 = pPVar1;
  local_198._M_data = &this->service;
  local_190._M_data = &this->context;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(boost::asio::io_context&,boost::asio::ssl::context&),hedg::Publisher*,std::reference_wrapper<boost::asio::io_context>,std::reference_wrapper<boost::asio::ssl::context>>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,
             (offset_in_Publisher_to_subr *)&local_188,&local_1a0,&local_198,&local_190);
  local_188._M_buckets = (__buckets_ptr)Publisher::get_data;
  local_188._M_bucket_count = 0;
  local_1a0 = pPVar1;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(),hedg::Publisher*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,
             (offset_in_Publisher_to_subr *)&local_188,&local_1a0);
  local_38 = &this->markets;
  local_188._M_buckets = &local_188._M_single_bucket;
  local_188._M_bucket_count = 1;
  local_188._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_188._M_element_count = 0;
  local_188._M_rehash_policy._M_max_load_factor = 1.0;
  local_188._M_rehash_policy._M_next_resize = 0;
  local_188._M_single_bucket = (__node_base_ptr)0x0;
  local_150._M_buckets = &local_150._M_single_bucket;
  local_150._M_bucket_count = 1;
  local_150._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_150._M_element_count = 0;
  local_150._M_rehash_policy._M_max_load_factor = 1.0;
  local_150._M_rehash_policy._M_next_resize = 0;
  local_150._M_single_bucket = (__node_base_ptr)0x0;
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_e0._M_buckets = &local_e0._M_single_bucket;
  local_e0._M_bucket_count = 1;
  local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0._M_element_count = 0;
  local_e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0._M_rehash_policy._M_next_resize = 0;
  local_e0._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_70._M_buckets = &local_70._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  pMVar2 = (Market_Handler *)operator_new(0x158);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)pMVar2,&local_188);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(pMVar2->traded)._M_h,&local_150,&local_150);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(pMVar2->traded_volume)._M_h,&local_118,&local_118);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(pMVar2->runner_loc)._M_h,&local_e0,&local_e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(pMVar2->runner_ids)._M_h,&local_a8,&local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(pMVar2->active)._M_h,&local_70,&local_70);
  pMVar2->active_markets_ = local_38;
  __ptr = (this->handler)._M_t.
          super___uniq_ptr_impl<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>.
          _M_t.
          super__Tuple_impl<0UL,_hedg::Market_Handler_*,_std::default_delete<hedg::Market_Handler>_>
          .super__Head_base<0UL,_hedg::Market_Handler_*,_false>._M_head_impl;
  (this->handler)._M_t.
  super___uniq_ptr_impl<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>._M_t.
  super__Tuple_impl<0UL,_hedg::Market_Handler_*,_std::default_delete<hedg::Market_Handler>_>.
  super__Head_base<0UL,_hedg::Market_Handler_*,_false>._M_head_impl = pMVar2;
  if (__ptr != (Market_Handler *)0x0) {
    std::default_delete<hedg::Market_Handler>::operator()
              ((default_delete<hedg::Market_Handler> *)&this->handler,__ptr);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_70);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_118);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_150);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_188);
  nThreads = std::thread::hardware_concurrency();
  ctpl::thread_pool::resize(&this->t_pool,nThreads);
  this->initialized = true;
  return;
}

Assistant:

void initialize() {
		threads.emplace_back(&MarketGenerator::generate, &gen);
		threads.emplace_back(&Publisher::run, &pub);
		threads.emplace_back(&Publisher::order_subscribe, &pub, std::ref(service), std::ref(context));
		threads.emplace_back(&Publisher::clean_up_markets, &pub, std::ref(service), std::ref(context));
		threads.emplace_back(&Publisher::get_data, &pub);
		handler = std::make_unique<Market_Handler>(Market_Handler(markets));
		t_pool.resize(std::thread::hardware_concurrency());
		initialized = true;

	}